

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::ThreadGroup::run(TestStatus *__return_storage_ptr__,ThreadGroup *this)

{
  ThreadGroupThread *pTVar1;
  pointer pcVar2;
  qpTestResult qVar3;
  TestStatus *extraout_RAX;
  TestStatus *pTVar4;
  pointer pSVar5;
  pointer pSVar6;
  ResultCollector resultCollector;
  string local_a8;
  TestStatus *local_88;
  undefined1 local_80 [48];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_88 = __return_storage_ptr__;
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_80);
  de::SpinBarrier::reset
            (&this->m_barrier,
             (deUint32)
             ((ulong)((long)(this->m_threads).
                            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_threads).
                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4));
  pSVar5 = (this->m_threads).
           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar5 != (this->m_threads).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pTVar1 = pSVar5->m_ptr;
      pTVar1->m_barrier = &this->m_barrier;
      de::Thread::start(&pTVar1->super_Thread);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != (this->m_threads).
                       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    pSVar6 = (this->m_threads).
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar5 != pSVar6) {
      do {
        pTVar1 = pSVar6->m_ptr;
        de::Thread::join(&pTVar1->super_Thread);
        qVar3 = tcu::ResultCollector::getResult(&pTVar1->m_resultCollector);
        pcVar2 = (pTVar1->m_resultCollector).m_message._M_dataplus._M_p;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar2,
                   pcVar2 + (pTVar1->m_resultCollector).m_message._M_string_length);
        tcu::ResultCollector::addResult((ResultCollector *)local_80,qVar3,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != (this->m_threads).
                         super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  qVar3 = tcu::ResultCollector::getResult((ResultCollector *)local_80);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_50._M_p,local_50._M_p + local_48);
  local_88->m_code = qVar3;
  (local_88->m_description)._M_dataplus._M_p = (pointer)&(local_88->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88->m_description,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  pTVar4 = (TestStatus *)(local_80 + 0x18);
  if ((TestStatus *)local_80._8_8_ != pTVar4) {
    operator_delete((void *)local_80._8_8_,local_80._24_8_ + 1);
    pTVar4 = extraout_RAX;
  }
  return pTVar4;
}

Assistant:

tcu::TestStatus ThreadGroup::run (void)
{
	tcu::ResultCollector	resultCollector;

	m_barrier.reset((int)m_threads.size());

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
		(*threadIter)->start(&m_barrier);

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
	{
		tcu::ResultCollector&	threadResult	= (*threadIter)->getResultCollector();
		(*threadIter)->join();
		resultCollector.addResult(threadResult.getResult(), threadResult.getMessage());
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}